

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O1

hwaddr ppc_hash32_bat_lookup(PowerPCCPU_conflict3 *cpu,target_ulong ea,int rwx,int *prot)

{
  powerpc_mmu_t pVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  hwaddr hVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong unaff_R15;
  
  hVar5 = 0xffffffffffffffff;
  if ((cpu->env).nb_BATs != 0) {
    uVar8 = 0;
    do {
      uVar6 = (cpu->env).DBAT[(ulong)(rwx == 2) * 2][uVar8];
      uVar2 = (cpu->env).DBAT[(ulong)(rwx == 2) * 2 + 1][uVar8];
      pVar1 = (cpu->env).mmu_model;
      uVar7 = (uint)uVar6;
      uVar9 = (uint)uVar2;
      if (pVar1 == POWERPC_MMU_601) {
        uVar6 = (ulong)((uint)((long)(uVar2 << 0x39) >> 0x3f) &
                       ((uVar9 & 0x3f) << 0x11 ^ 0xfffe0000));
      }
      else {
        uVar3 = (cpu->env).msr;
        if ((((uVar6 & 1) == 0 & (byte)(((uint)uVar3 & 0x4000) >> 0xe)) == 0) &&
           ((uVar3 & 0x4000) != 0 || (uVar6 & 2) != 0)) {
          uVar6 = (ulong)((uVar7 & 0x1ffc) << 0xf) ^ 0xfffe0000;
        }
        else {
          uVar6 = 0;
        }
      }
      bVar4 = true;
      if ((uVar6 != 0) && (((uint)uVar6 & (uint)ea) == (uVar7 & 0xfffe0000))) {
        if (pVar1 == POWERPC_MMU_601) {
          if (((uint)(((cpu->env).msr & 0x4000) == 0) * 4 + 4 & uVar7) == 0) {
            uVar7 = (uint)((~uVar7 & 3) != 0) * 2 + 5;
          }
          else {
            uVar7 = *(uint *)(&DAT_00dbc8e8 + (ulong)(uVar7 & 3) * 4);
          }
        }
        else {
          uVar7 = (uint)((uVar9 & 3) == 2) * 2 + 5;
          if ((uVar2 & 3) == 0) {
            uVar7 = uVar9 & 3;
          }
        }
        *prot = uVar7;
        unaff_R15 = ~uVar6 & ea & 0xfffffffffffff000 | (ulong)(uVar9 & (uint)uVar6);
        bVar4 = false;
      }
      hVar5 = unaff_R15;
    } while ((bVar4) && (uVar8 = uVar8 + 1, hVar5 = 0xffffffffffffffff, uVar8 < (cpu->env).nb_BATs))
    ;
  }
  return hVar5;
}

Assistant:

static hwaddr ppc_hash32_bat_lookup(PowerPCCPU *cpu, target_ulong ea, int rwx,
                                    int *prot)
{
    CPUPPCState *env = &cpu->env;
    target_ulong *BATlt, *BATut;
    int i;

    LOG_BATS("%s: %cBAT v " TARGET_FMT_lx "\n", __func__,
             rwx == 2 ? 'I' : 'D', ea);
    if (rwx == 2) {
        BATlt = env->IBAT[1];
        BATut = env->IBAT[0];
    } else {
        BATlt = env->DBAT[1];
        BATut = env->DBAT[0];
    }
    for (i = 0; i < env->nb_BATs; i++) {
        target_ulong batu = BATut[i];
        target_ulong batl = BATlt[i];
        target_ulong mask;

        if (unlikely(env->mmu_model == POWERPC_MMU_601)) {
            mask = hash32_bat_601_size(cpu, batu, batl);
        } else {
            mask = hash32_bat_size(cpu, batu, batl);
        }
        LOG_BATS("%s: %cBAT%d v " TARGET_FMT_lx " BATu " TARGET_FMT_lx
                 " BATl " TARGET_FMT_lx "\n", __func__,
                 type == ACCESS_CODE ? 'I' : 'D', i, ea, batu, batl);

        if (mask && ((ea & mask) == (batu & BATU32_BEPI))) {
            hwaddr raddr = (batl & mask) | (ea & ~mask);

            if (unlikely(env->mmu_model == POWERPC_MMU_601)) {
                *prot = hash32_bat_601_prot(cpu, batu, batl);
            } else {
                *prot = hash32_bat_prot(cpu, batu, batl);
            }

            return raddr & TARGET_PAGE_MASK;
        }
    }

    /* No hit */
#if defined(DEBUG_BATS)
    if (qemu_log_enabled()) {
        LOG_BATS("no BAT match for " TARGET_FMT_lx ":\n", ea);
        for (i = 0; i < 4; i++) {
            BATu = &BATut[i];
            BATl = &BATlt[i];
            BEPIu = *BATu & BATU32_BEPIU;
            BEPIl = *BATu & BATU32_BEPIL;
            bl = (*BATu & 0x00001FFC) << 15;
            LOG_BATS("%s: %cBAT%d v " TARGET_FMT_lx " BATu " TARGET_FMT_lx
                     " BATl " TARGET_FMT_lx "\n\t" TARGET_FMT_lx " "
                     TARGET_FMT_lx " " TARGET_FMT_lx "\n",
                     __func__, type == ACCESS_CODE ? 'I' : 'D', i, ea,
                     *BATu, *BATl, BEPIu, BEPIl, bl);
        }
    }
#endif

    return -1;
}